

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O2

fasttext_tokens_t * cft_fasttext_tokenize(fasttext_t *handle,char *text)

{
  bool bVar1;
  fasttext_tokens_t *pfVar2;
  char **ppcVar3;
  char *pcVar4;
  size_t sVar5;
  size_t i;
  size_t sVar6;
  long lVar7;
  pointer pbVar8;
  allocator local_1f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  text_split;
  shared_ptr<const_fasttext::Dictionary> d;
  string token;
  stringstream ioss;
  byte abStack_190 [360];
  
  text_split.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  text_split.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  text_split.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fasttext::FastText::getDictionary((FastText *)&d);
  std::__cxx11::string::string((string *)&token,text,&local_1f9);
  std::__cxx11::stringstream::stringstream((stringstream *)&ioss,(string *)&token,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&token);
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  while (pbVar8 = text_split.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        (abStack_190[(long)_ioss[-1]._vptr_Matrix] & 2) == 0) {
    while( true ) {
      bVar1 = fasttext::Dictionary::readWord
                        (d.
                         super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,(istream *)&ioss,&token);
      if (!bVar1) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&text_split,&token);
    }
  }
  lVar7 = (long)text_split.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)text_split.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  sVar5 = lVar7 >> 5;
  pfVar2 = (fasttext_tokens_t *)malloc(0x10);
  pfVar2->length = sVar5;
  ppcVar3 = (char **)malloc(lVar7 >> 2);
  for (sVar6 = 0; sVar5 != sVar6; sVar6 = sVar6 + 1) {
    pcVar4 = strdup((pbVar8->_M_dataplus)._M_p);
    ppcVar3[sVar6] = pcVar4;
    pbVar8 = pbVar8 + 1;
  }
  pfVar2->tokens = ppcVar3;
  std::__cxx11::string::~string((string *)&token);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ioss);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&d.super___shared_ptr<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&text_split);
  return pfVar2;
}

Assistant:

fasttext_tokens_t* cft_fasttext_tokenize(fasttext_t* handle, const char* text) {
    std::vector<std::string> text_split;
    std::shared_ptr<const fasttext::Dictionary> d = ((FastText*)handle)->getDictionary();
    std::stringstream ioss(text);
    std::string token;
    while (!ioss.eof()) {
        while (d->readWord(ioss, token)) {
        text_split.push_back(token);
        }
    }
    size_t len = text_split.size();
    fasttext_tokens_t* ret = static_cast<fasttext_tokens_t*>(malloc(sizeof(fasttext_tokens_t)));
    ret->length = len;
    char** tokens = static_cast<char**>(malloc(sizeof(char*) * len));
    for (size_t i = 0; i < len; i++) {
        tokens[i] = strdup(text_split[i].c_str());
    }
    ret->tokens = tokens;
    return ret;
}